

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O2

uint32_t spvtools::opt::anon_unknown_0::GetNumberOfMembers(Type *type,IRContext *context)

{
  int iVar1;
  uint32_t uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ConstantManager *this;
  Constant *this_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar3;
  
  iVar1 = (*type->_vptr_Type[0x1e])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (lVar3 != 0) {
    return (uint32_t)((ulong)(*(long *)(lVar3 + 0x30) - *(long *)(lVar3 + 0x28)) >> 3);
  }
  iVar1 = (*type->_vptr_Type[0x18])(type);
  if (CONCAT44(extraout_var_00,iVar1) == 0) {
    iVar1 = (*type->_vptr_Type[0xe])(type);
    lVar3 = CONCAT44(extraout_var_02,iVar1);
    if (lVar3 == 0) {
      iVar1 = (*type->_vptr_Type[0x10])(type);
      lVar3 = CONCAT44(extraout_var_03,iVar1);
      if (lVar3 == 0) goto LAB_004a101f;
    }
    uVar2 = *(uint32_t *)(lVar3 + 0x30);
  }
  else {
    this = IRContext::get_constant_mgr(context);
    this_00 = analysis::ConstantManager::FindDeclaredConstant
                        (this,*(uint32_t *)(CONCAT44(extraout_var_00,iVar1) + 0x30));
    if (this_00 != (Constant *)0x0) {
      iVar1 = (*this_00->type_->_vptr_Type[10])();
      if (CONCAT44(extraout_var_01,iVar1) == 0) {
        __assert_fail("length_const->type()->AsInteger()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                      ,0x38,
                      "uint32_t spvtools::opt::(anonymous namespace)::GetNumberOfMembers(const analysis::Type *, IRContext *)"
                     );
      }
      uVar2 = analysis::Constant::GetU32(this_00);
      return uVar2;
    }
LAB_004a101f:
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

uint32_t GetNumberOfMembers(const analysis::Type* type, IRContext* context) {
  if (const analysis::Struct* struct_type = type->AsStruct()) {
    return static_cast<uint32_t>(struct_type->element_types().size());
  } else if (const analysis::Array* array_type = type->AsArray()) {
    const analysis::Constant* length_const =
        context->get_constant_mgr()->FindDeclaredConstant(
            array_type->LengthId());

    if (length_const == nullptr) {
      // This can happen if the length is an OpSpecConstant.
      return 0;
    }
    assert(length_const->type()->AsInteger());
    return length_const->GetU32();
  } else if (const analysis::Vector* vector_type = type->AsVector()) {
    return vector_type->element_count();
  } else if (const analysis::Matrix* matrix_type = type->AsMatrix()) {
    return matrix_type->element_count();
  } else {
    return 0;
  }
}